

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

long __thiscall mkvparser::Block::Parse(Block *this,Cluster *pCluster)

{
  IMkvReader *pReader;
  byte bVar1;
  Frame *pFVar2;
  longlong *plVar3;
  IMkvReader *pIVar4;
  int iVar5;
  longlong lVar6;
  long lVar7;
  Frame *pFVar8;
  long lVar9;
  ulong uVar10;
  byte bVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  Frame *curr;
  long lVar15;
  ulong uVar16;
  long lVar17;
  Frame *pFVar18;
  bool bVar19;
  Frame *f;
  uchar val;
  uchar biased_count;
  long len;
  longlong value;
  Frame *local_78;
  byte local_62;
  byte local_61;
  Frame *local_60;
  ulong local_58;
  long local_50;
  IMkvReader *local_48;
  ulong local_40;
  long local_38;
  
  if (pCluster == (Cluster *)0x0) {
    return -1;
  }
  if (pCluster->m_pSegment == (Segment *)0x0) {
    return -1;
  }
  lVar15 = this->m_start;
  lVar12 = this->m_size;
  pReader = pCluster->m_pSegment->m_pReader;
  lVar6 = ReadUInt(pReader,lVar15,&local_50);
  lVar13 = local_50;
  this->m_track = lVar6;
  if (lVar6 < 1) {
    return -2;
  }
  if (lVar12 - local_50 < 2 || lVar12 < local_50) {
    return -2;
  }
  lVar17 = lVar15 + local_50;
  lVar7 = UnserializeInt(pReader,lVar17,2,&local_38);
  if (lVar7 != 0) {
    return -2;
  }
  if ((short)local_38 != local_38) {
    return -2;
  }
  lVar15 = lVar15 + lVar12;
  this->m_timecode = (short)local_38;
  if (lVar15 <= lVar17 + 2) {
    return -2;
  }
  local_48 = pReader;
  iVar5 = (**pReader->_vptr_IMkvReader)(pReader,lVar17 + 2,1,&this->m_flags);
  if (iVar5 != 0) {
    return -2;
  }
  bVar1 = this->m_flags >> 1;
  lVar7 = lVar17 + 3;
  bVar11 = bVar1 & 3;
  if ((bVar1 & 3) == 0) {
    this->m_frame_count = 1;
    pFVar8 = (Frame *)operator_new__(0x10,(nothrow_t *)&std::nothrow);
    this->m_frames = pFVar8;
    if (pFVar8 == (Frame *)0x0) {
      return -1;
    }
    pFVar8->pos = lVar7;
    if (lVar15 - lVar7 != 0 && lVar7 <= lVar15) {
      pFVar8->len = lVar15 - lVar7;
      return 0;
    }
    return -2;
  }
  if (lVar15 <= lVar7) {
    return -2;
  }
  iVar5 = (**pReader->_vptr_IMkvReader)(pReader,lVar7,1,&local_61);
  if (iVar5 != 0) {
    return -2;
  }
  local_58 = (ulong)local_61;
  uVar14 = local_61 + 1;
  uVar10 = (ulong)uVar14;
  this->m_frame_count = uVar14;
  local_60 = (Frame *)(ulong)(uVar14 * 0x10);
  local_78 = (Frame *)operator_new__((ulong)local_60,(nothrow_t *)&std::nothrow);
  pIVar4 = local_48;
  this->m_frames = local_78;
  if (local_78 == (Frame *)0x0) {
    return -1;
  }
  lVar17 = lVar17 + 4;
  if (bVar11 == 2) {
    lVar7 = lVar15 - lVar17;
    if (lVar7 == 0 || lVar15 < lVar17) {
      return -2;
    }
    lVar9 = lVar7 / (long)uVar10;
    if (lVar7 % (long)uVar10 != 0) {
      return -2;
    }
    if (lVar9 < 1) {
      return -2;
    }
    plVar3 = &local_78->pos;
    lVar12 = (lVar13 - lVar12) + 4;
    do {
      if (lVar15 < lVar17 + lVar9) {
        return -2;
      }
      local_78->pos = lVar17;
      local_78->len = lVar9;
      local_78 = local_78 + 1;
      lVar12 = lVar12 + lVar9;
      lVar17 = lVar17 + lVar9;
    } while (local_78 != (Frame *)((long)plVar3 + (ulong)(uVar14 * 0x10)));
    bVar19 = lVar12 == 0;
    goto LAB_00164589;
  }
  if (bVar11 == 1) {
    local_60 = (Frame *)((long)&local_78->pos + (long)local_60);
    if ((int)local_58 == 0) {
      lVar12 = 0;
    }
    else {
      lVar12 = 0;
      local_40 = uVar10;
      do {
        lVar13 = lVar17;
        if (lVar15 <= lVar13) {
          return -2;
        }
        lVar17 = 0;
        while( true ) {
          iVar5 = (**pIVar4->_vptr_IMkvReader)(pIVar4,lVar13,1,&local_62);
          if (iVar5 != 0) {
            return -2;
          }
          lVar17 = lVar17 + (ulong)local_62;
          if ((ulong)local_62 != 0xff) break;
          lVar13 = lVar13 + 1;
          if (lVar15 <= lVar13) {
            return -2;
          }
        }
        pFVar8 = local_78 + 1;
        if (local_60 <= pFVar8) {
          return -2;
        }
        local_78->pos = 0;
        if (lVar17 == 0) {
          return -2;
        }
        local_78->len = lVar17;
        lVar12 = lVar12 + lVar17;
        iVar5 = (int)local_40;
        local_40 = (ulong)(iVar5 - 1);
        lVar17 = lVar13 + 1;
        local_78 = pFVar8;
      } while (2 < iVar5);
      lVar17 = lVar13 + 1;
    }
    lVar13 = lVar15 - lVar17;
    if (local_78 + 1 != local_60 || (lVar15 < lVar17 || local_60 <= local_78)) {
      return -2;
    }
    local_78->pos = 0;
    if (lVar13 < lVar12) {
      return -2;
    }
    if (lVar13 - lVar12 == 0 || lVar13 < lVar12) {
      return -2;
    }
    local_78->len = lVar13 - lVar12;
    local_78 = (Frame *)lVar17;
    for (pFVar8 = this->m_frames; pFVar8 != local_60; pFVar8 = pFVar8 + 1) {
      lVar12 = pFVar8->len + (long)local_78;
      if (lVar15 < lVar12) {
        return -2;
      }
      pFVar8->pos = (longlong)local_78;
      local_78 = (Frame *)lVar12;
    }
  }
  else {
    if (lVar15 <= lVar17) {
      return -2;
    }
    uVar10 = ReadUInt(pReader,lVar17,&local_50);
    if ((long)uVar10 < 1) {
      return -2;
    }
    local_78 = (Frame *)(lVar17 + local_50);
    if (lVar15 < (long)((long)local_78 + uVar10) || lVar15 < (long)local_78) {
      return -2;
    }
    pFVar8 = this->m_frames;
    pFVar18 = pFVar8 + this->m_frame_count;
    pFVar8->pos = 0;
    pFVar8->len = uVar10;
    uVar16 = uVar10;
    pFVar2 = pFVar8;
    if ((byte)local_58 < 2) {
      if ((int)local_58 == 1) goto LAB_001644ea;
    }
    else {
      do {
        pFVar8 = pFVar2 + 1;
        if (lVar15 <= (long)local_78) {
          return -2;
        }
        if (pFVar18 <= pFVar2) {
          return -2;
        }
        if (pFVar2->len != uVar10) {
          return -2;
        }
        if (pFVar18 <= pFVar8) {
          return -2;
        }
        pFVar8->pos = 0;
        lVar6 = ReadUInt(local_48,(longlong)local_78,&local_50);
        if (lVar6 < 0) {
          return -2;
        }
        local_78 = (Frame *)((long)local_78 + local_50);
        if (lVar15 < (long)local_78) {
          return -2;
        }
        uVar10 = uVar10 + lVar6 + (-1L << ((char)local_50 * '\a' - 1U & 0x3f)) + 1;
        if ((long)uVar10 < 1) {
          return -2;
        }
        pFVar2[1].len = uVar10;
        if ((long)(uVar10 ^ 0x7fffffffffffffff) < (long)uVar16) {
          return -2;
        }
        uVar16 = uVar16 + uVar10;
        uVar14 = (int)local_58 - 1;
        local_58 = (ulong)uVar14;
        pFVar2 = pFVar8;
      } while (1 < uVar14);
LAB_001644ea:
      lVar12 = lVar15 - (long)local_78;
      if (((lVar15 < (long)local_78) || (pFVar18 <= pFVar8)) ||
         ((pFVar8 + 2 != pFVar18 || uVar10 != pFVar8->len) || pFVar18 <= pFVar8 + 1)) {
        return -2;
      }
      pFVar8[1].pos = 0;
      if (lVar12 < (long)uVar16) {
        return -2;
      }
      if (lVar12 - uVar16 == 0 || lVar12 < (long)uVar16) {
        return -2;
      }
      pFVar8[1].len = lVar12 - uVar16;
    }
    for (pFVar8 = this->m_frames; pFVar8 != pFVar18; pFVar8 = pFVar8 + 1) {
      lVar12 = pFVar8->len + (long)local_78;
      if (lVar15 < lVar12) {
        return -2;
      }
      pFVar8->pos = (longlong)local_78;
      local_78 = (Frame *)lVar12;
    }
  }
  bVar19 = local_78 == (Frame *)lVar15;
LAB_00164589:
  if (bVar19) {
    return 0;
  }
  return -2;
}

Assistant:

long Block::Parse(const Cluster* pCluster) {
  if (pCluster == NULL)
    return -1;

  if (pCluster->m_pSegment == NULL)
    return -1;

  assert(m_start >= 0);
  assert(m_size >= 0);
  assert(m_track <= 0);
  assert(m_frames == NULL);
  assert(m_frame_count <= 0);

  long long pos = m_start;
  const long long stop = m_start + m_size;

  long len;

  IMkvReader* const pReader = pCluster->m_pSegment->m_pReader;

  m_track = ReadUInt(pReader, pos, len);

  if (m_track <= 0)
    return E_FILE_FORMAT_INVALID;

  if ((pos + len) > stop)
    return E_FILE_FORMAT_INVALID;

  pos += len;  // consume track number

  if ((stop - pos) < 2)
    return E_FILE_FORMAT_INVALID;

  long status;
  long long value;

  status = UnserializeInt(pReader, pos, 2, value);

  if (status)
    return E_FILE_FORMAT_INVALID;

  if (value < SHRT_MIN)
    return E_FILE_FORMAT_INVALID;

  if (value > SHRT_MAX)
    return E_FILE_FORMAT_INVALID;

  m_timecode = static_cast<short>(value);

  pos += 2;

  if ((stop - pos) <= 0)
    return E_FILE_FORMAT_INVALID;

  status = pReader->Read(pos, 1, &m_flags);

  if (status)
    return E_FILE_FORMAT_INVALID;

  const int lacing = int(m_flags & 0x06) >> 1;

  ++pos;  // consume flags byte

  if (lacing == 0) {  // no lacing
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;

    m_frame_count = 1;
    m_frames = new (std::nothrow) Frame[m_frame_count];
    if (m_frames == NULL)
      return -1;

    Frame& f = m_frames[0];
    f.pos = pos;

    const long long frame_size = stop - pos;

    if (frame_size > LONG_MAX || frame_size <= 0)
      return E_FILE_FORMAT_INVALID;

    f.len = static_cast<long>(frame_size);

    return 0;  // success
  }

  if (pos >= stop)
    return E_FILE_FORMAT_INVALID;

  unsigned char biased_count;

  status = pReader->Read(pos, 1, &biased_count);

  if (status)
    return E_FILE_FORMAT_INVALID;

  ++pos;  // consume frame count
  if (pos > stop)
    return E_FILE_FORMAT_INVALID;

  m_frame_count = int(biased_count) + 1;

  m_frames = new (std::nothrow) Frame[m_frame_count];
  if (m_frames == NULL)
    return -1;

  if (!m_frames)
    return E_FILE_FORMAT_INVALID;

  if (lacing == 1) {  // Xiph
    Frame* pf = m_frames;
    Frame* const pf_end = pf + m_frame_count;

    long long size = 0;
    int frame_count = m_frame_count;

    while (frame_count > 1) {
      long frame_size = 0;

      for (;;) {
        unsigned char val;

        if (pos >= stop)
          return E_FILE_FORMAT_INVALID;

        status = pReader->Read(pos, 1, &val);

        if (status)
          return E_FILE_FORMAT_INVALID;

        ++pos;  // consume xiph size byte

        frame_size += val;

        if (val < 255)
          break;
      }

      Frame& f = *pf++;
      assert(pf < pf_end);
      if (pf >= pf_end)
        return E_FILE_FORMAT_INVALID;

      f.pos = 0;  // patch later

      if (frame_size <= 0)
        return E_FILE_FORMAT_INVALID;

      f.len = frame_size;
      size += frame_size;  // contribution of this frame

      --frame_count;
    }

    if (pf >= pf_end || pos > stop)
      return E_FILE_FORMAT_INVALID;

    {
      Frame& f = *pf++;

      if (pf != pf_end)
        return E_FILE_FORMAT_INVALID;

      f.pos = 0;  // patch later

      const long long total_size = stop - pos;

      if (total_size < size)
        return E_FILE_FORMAT_INVALID;

      const long long frame_size = total_size - size;

      if (frame_size > LONG_MAX || frame_size <= 0)
        return E_FILE_FORMAT_INVALID;

      f.len = static_cast<long>(frame_size);
    }

    pf = m_frames;
    while (pf != pf_end) {
      Frame& f = *pf++;
      assert((pos + f.len) <= stop);

      if ((pos + f.len) > stop)
        return E_FILE_FORMAT_INVALID;

      f.pos = pos;
      pos += f.len;
    }

    assert(pos == stop);
    if (pos != stop)
      return E_FILE_FORMAT_INVALID;

  } else if (lacing == 2) {  // fixed-size lacing
    if (pos >= stop)
      return E_FILE_FORMAT_INVALID;

    const long long total_size = stop - pos;

    if ((total_size % m_frame_count) != 0)
      return E_FILE_FORMAT_INVALID;

    const long long frame_size = total_size / m_frame_count;

    if (frame_size > LONG_MAX || frame_size <= 0)
      return E_FILE_FORMAT_INVALID;

    Frame* pf = m_frames;
    Frame* const pf_end = pf + m_frame_count;

    while (pf != pf_end) {
      assert((pos + frame_size) <= stop);
      if ((pos + frame_size) > stop)
        return E_FILE_FORMAT_INVALID;

      Frame& f = *pf++;

      f.pos = pos;
      f.len = static_cast<long>(frame_size);

      pos += frame_size;
    }

    assert(pos == stop);
    if (pos != stop)
      return E_FILE_FORMAT_INVALID;

  } else {
    assert(lacing == 3);  // EBML lacing

    if (pos >= stop)
      return E_FILE_FORMAT_INVALID;

    long long size = 0;
    int frame_count = m_frame_count;

    long long frame_size = ReadUInt(pReader, pos, len);

    if (frame_size <= 0)
      return E_FILE_FORMAT_INVALID;

    if (frame_size > LONG_MAX)
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > stop)
      return E_FILE_FORMAT_INVALID;

    pos += len;  // consume length of size of first frame

    if ((pos + frame_size) > stop)
      return E_FILE_FORMAT_INVALID;

    Frame* pf = m_frames;
    Frame* const pf_end = pf + m_frame_count;

    {
      Frame& curr = *pf;

      curr.pos = 0;  // patch later

      curr.len = static_cast<long>(frame_size);
      size += curr.len;  // contribution of this frame
    }

    --frame_count;

    while (frame_count > 1) {
      if (pos >= stop)
        return E_FILE_FORMAT_INVALID;

      assert(pf < pf_end);
      if (pf >= pf_end)
        return E_FILE_FORMAT_INVALID;

      const Frame& prev = *pf++;
      assert(prev.len == frame_size);
      if (prev.len != frame_size)
        return E_FILE_FORMAT_INVALID;

      assert(pf < pf_end);
      if (pf >= pf_end)
        return E_FILE_FORMAT_INVALID;

      Frame& curr = *pf;

      curr.pos = 0;  // patch later

      const long long delta_size_ = ReadUInt(pReader, pos, len);

      if (delta_size_ < 0)
        return E_FILE_FORMAT_INVALID;

      if ((pos + len) > stop)
        return E_FILE_FORMAT_INVALID;

      pos += len;  // consume length of (delta) size
      if (pos > stop)
        return E_FILE_FORMAT_INVALID;

      const long exp = 7 * len - 1;
      const long long bias = (1LL << exp) - 1LL;
      const long long delta_size = delta_size_ - bias;

      frame_size += delta_size;

      if (frame_size <= 0)
        return E_FILE_FORMAT_INVALID;

      if (frame_size > LONG_MAX)
        return E_FILE_FORMAT_INVALID;

      curr.len = static_cast<long>(frame_size);
      // Check if size + curr.len could overflow.
      if (size > LLONG_MAX - curr.len) {
        return E_FILE_FORMAT_INVALID;
      }
      size += curr.len;  // contribution of this frame

      --frame_count;
    }

    // parse last frame
    if (frame_count > 0) {
      if (pos > stop || pf >= pf_end)
        return E_FILE_FORMAT_INVALID;

      const Frame& prev = *pf++;
      assert(prev.len == frame_size);
      if (prev.len != frame_size)
        return E_FILE_FORMAT_INVALID;

      if (pf >= pf_end)
        return E_FILE_FORMAT_INVALID;

      Frame& curr = *pf++;
      if (pf != pf_end)
        return E_FILE_FORMAT_INVALID;

      curr.pos = 0;  // patch later

      const long long total_size = stop - pos;

      if (total_size < size)
        return E_FILE_FORMAT_INVALID;

      frame_size = total_size - size;

      if (frame_size > LONG_MAX || frame_size <= 0)
        return E_FILE_FORMAT_INVALID;

      curr.len = static_cast<long>(frame_size);
    }

    pf = m_frames;
    while (pf != pf_end) {
      Frame& f = *pf++;
      if ((pos + f.len) > stop)
        return E_FILE_FORMAT_INVALID;

      f.pos = pos;
      pos += f.len;
    }

    if (pos != stop)
      return E_FILE_FORMAT_INVALID;
  }

  return 0;  // success
}